

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,unsigned_long_long value)

{
  bool bVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char_type buffer [26];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_58;
  char local_48 [40];
  
  lVar5 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar6 = ((uint)lVar5 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar7 = (ulong)((uVar6 - (value < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)
                                           [uVar6])) + 1);
  pcVar2 = local_48 + uVar7;
  uVar4 = value;
  if (99 < value) {
    do {
      value = uVar4 / 100;
      *(undefined2 *)(pcVar2 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar4 + (int)value * -100) * 2)
      ;
      pcVar2 = pcVar2 + -2;
      bVar1 = 9999 < uVar4;
      uVar4 = value;
    } while (bVar1);
  }
  local_58._M_stream = (this->out_)._M_stream;
  local_58._M_string = (this->out_)._M_string;
  if (value < 10) {
    bVar3 = (byte)value | 0x30;
    lVar5 = -1;
  }
  else {
    pcVar2[-1] = internal::basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    bVar3 = internal::basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
    lVar5 = -2;
  }
  pcVar2[lVar5] = bVar3;
  if (uVar7 != 0) {
    pcVar2 = local_48;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_58,pcVar2);
      pcVar2 = pcVar2 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  (this->out_)._M_stream = local_58._M_stream;
  (this->out_)._M_string = local_58._M_string;
  return;
}

Assistant:

inline int count_digits(uint64_t n) {
  // Based on http://graphics.stanford.edu/~seander/bithacks.html#IntegerLog10
  // and the benchmark https://github.com/localvoid/cxx-benchmark-count-digits.
  int t = (64 - FMT_BUILTIN_CLZLL(n | 1)) * 1233 >> 12;
  return t - (n < data::ZERO_OR_POWERS_OF_10_64[t]) + 1;
}